

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O2

int amqp_device_subscribe_message
              (AMQP_DEVICE_HANDLE handle,ON_DEVICE_C2D_MESSAGE_RECEIVED on_message_received_callback
              ,void *context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  AMQP_DEVICE_INSTANCE_conflict *instance;
  
  if ((on_message_received_callback == (ON_DEVICE_C2D_MESSAGE_RECEIVED)0x0 ||
      handle == (AMQP_DEVICE_HANDLE)0x0) || context == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x4e5;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"amqp_device_subscribe_message",0x4e4,1,
                "Failed subscribing to C2D messages (either handle (%p), on_message_received_callback (%p) or context (%p) is NULL)"
                ,handle,on_message_received_callback,context);
    }
  }
  else {
    iVar1 = telemetry_messenger_subscribe_for_messages
                      (handle->messenger_handle,on_messenger_message_received_callback,handle);
    if (iVar1 == 0) {
      handle->on_message_received_callback = on_message_received_callback;
      handle->on_message_received_context = context;
      iVar1 = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x4ee;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                  ,"amqp_device_subscribe_message",0x4ed,1,
                  "Failed subscribing to C2D messages (telemetry_messenger_subscribe_for_messages failed)"
                 );
      }
    }
  }
  return iVar1;
}

Assistant:

int amqp_device_subscribe_message(AMQP_DEVICE_HANDLE handle, ON_DEVICE_C2D_MESSAGE_RECEIVED on_message_received_callback, void* context)
{
    int result;

    if (handle == NULL || on_message_received_callback == NULL || context == NULL)
    {
        LogError("Failed subscribing to C2D messages (either handle (%p), on_message_received_callback (%p) or context (%p) is NULL)",
            handle, on_message_received_callback, context);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_DEVICE_INSTANCE* instance = (AMQP_DEVICE_INSTANCE*)handle;

        if (telemetry_messenger_subscribe_for_messages(instance->messenger_handle, on_messenger_message_received_callback, handle) != RESULT_OK)
        {
            LogError("Failed subscribing to C2D messages (telemetry_messenger_subscribe_for_messages failed)");
            result = MU_FAILURE;
        }
        else
        {
            instance->on_message_received_callback = on_message_received_callback;
            instance->on_message_received_context = context;

            result = RESULT_OK;
        }
    }

    return result;
}